

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

void __thiscall HPresolve::setVariablesToBoundForForcingRow(HPresolve *this,int row,bool isLower)

{
  int *piVar1;
  vector<double,_std::allocator<double>_> *this_00;
  int iVar2;
  ostream *poVar3;
  reference pvVar4;
  reference pvVar5;
  undefined7 in_register_00000011;
  vector<double,_std::allocator<double>_> *this_01;
  size_type sVar6;
  size_type __n;
  initializer_list<double> __l;
  allocator_type local_d5;
  undefined4 local_d4;
  int local_d0;
  int row_local;
  vector<double,_std::allocator<double>_> *local_c8;
  vector<double,_std::allocator<double>_> *local_c0;
  size_type local_b8;
  deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
  *local_b0;
  vector<double,_std::allocator<double>_> *local_a8;
  vector<double,_std::allocator<double>_> *local_a0;
  double local_98;
  vector<int,_std::allocator<int>_> *local_90;
  vector<int,_std::allocator<int>_> *local_88;
  size_type local_80;
  vector<int,_std::allocator<int>_> *local_78;
  value_type local_70;
  value_type local_68;
  _Vector_base<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> bnds;
  
  local_d4 = (undefined4)CONCAT71(in_register_00000011,isLower);
  row_local = row;
  if (0 < this->iPrint) {
    poVar3 = std::operator<<((ostream *)&std::cout,"PR: Forcing row ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,row);
    poVar3 = std::operator<<(poVar3," removed. Following variables too:   nzRow=");
    pvVar4 = std::vector<int,_std::allocator<int>_>::at(&(this->super_HPreData).nzRow,(long)row);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  sVar6 = (size_type)row;
  pvVar4 = std::vector<int,_std::allocator<int>_>::at(&(this->super_HPreData).flagRow,sVar6);
  *pvVar4 = 0;
  addChange(this,4,row,0);
  local_78 = &(this->super_HPreData).ARstart;
  local_b8 = sVar6;
  pvVar4 = std::vector<int,_std::allocator<int>_>::at(local_78,sVar6);
  local_88 = &(this->super_HPreData).ARindex;
  local_90 = &(this->super_HPreData).flagCol;
  local_c0 = &(this->super_HPreData).ARvalue;
  local_c8 = &(this->super_HPreData).colLower;
  this_00 = &(this->super_HPreData).colUpper;
  local_a0 = &(this->super_HPreData).colCost;
  local_a8 = &(this->super_HPreData).valueColDual;
  local_b0 = (deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
              *)&(this->super_HPreData).oldBounds;
  local_80 = (size_type)(row + 1);
  for (sVar6 = (size_type)*pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::at(local_78,local_80),
      (long)sVar6 < (long)*pvVar4; sVar6 = sVar6 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::at(local_88,sVar6);
    iVar2 = *pvVar4;
    __n = (size_type)iVar2;
    pvVar4 = std::vector<int,_std::allocator<int>_>::at(local_90,__n);
    if (*pvVar4 != 0) {
      local_d0 = iVar2;
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(local_c0,sVar6);
      this_01 = this_00;
      if (((byte)local_d4 & (*pvVar5 <= 0.0 && *pvVar5 != 0.0)) == 0) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::at(local_c0,sVar6);
        if ((byte)local_d4 != '\0') {
          this_01 = local_c8;
        }
        if (*pvVar5 <= 0.0) {
          this_01 = local_c8;
        }
      }
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_01,__n);
      local_98 = *pvVar5;
      setPrimalValue(this,iVar2,local_98);
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(local_a0,__n);
      local_70 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(local_a8,__n);
      *pvVar5 = local_70;
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(local_c8,__n);
      local_68 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(this_00,__n);
      local_60._M_impl.super__Vector_impl_data._M_start = (pointer)*pvVar5;
      __l._M_len = 2;
      __l._M_array = (iterator)&local_68;
      std::vector<double,_std::allocator<double>_>::vector(&bnds,__l,&local_d5);
      local_68 = (value_type)CONCAT44(local_68._4_4_,iVar2);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_60,&bnds);
      std::
      deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
      ::emplace_back<std::pair<int,std::vector<double,std::allocator<double>>>>
                (local_b0,(pair<int,_std::vector<double,_std::allocator<double>_>_> *)&local_68);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
      iVar2 = local_d0;
      addChange(this,0x15,0,local_d0);
      if (0 < this->iPrint) {
        poVar3 = std::operator<<((ostream *)&std::cout,"PR:      Variable  ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
        std::operator<<(poVar3," := ");
        poVar3 = std::ostream::_M_insert<double>(local_98);
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      piVar1 = (this->countRemovedCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + 4;
      *piVar1 = *piVar1 + 1;
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&bnds.super__Vector_base<double,_std::allocator<double>_>);
    }
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::at(&(this->super_HPreData).nzRow,local_b8);
  if (*pvVar4 == 1) {
    std::__cxx11::list<int,_std::allocator<int>_>::remove(&this->singRow,(char *)&row_local);
  }
  piVar1 = (this->countRemovedRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 4;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void HPresolve::setVariablesToBoundForForcingRow(const int row, const bool isLower) {
	int k, col;
	if (iPrint > 0)
		cout << "PR: Forcing row " << row
				<< " removed. Following variables too:   nzRow=" << nzRow.at(row)
				<< endl;

	flagRow.at(row) = 0;
	addChange(FORCING_ROW, row, 0);
	k = ARstart.at(row);
	while (k < ARstart.at(row + 1)) {
		col = ARindex.at(k);
		if (flagCol.at(col)) {
			double value;
			if ((ARvalue.at(k) < 0 && isLower)
					|| (ARvalue.at(k) > 0 && !isLower))
				value = colUpper.at(col);
			else
				value = colLower.at(col);

			setPrimalValue(col, value);
			valueColDual.at(col) = colCost.at(col);
			vector<double> bnds({colLower.at(col), colUpper.at(col)});
			oldBounds.push(make_pair(col, bnds));
			addChange(FORCING_ROW_VARIABLE, 0, col);

			if (iPrint > 0)
				cout << "PR:      Variable  " << col << " := " << value << endl;
			countRemovedCols[FORCING_ROW]++;
		}
		++k;
	}

	if (nzRow.at(row) == 1)
		singRow.remove(row);

	countRemovedRows[FORCING_ROW]++;
}